

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  long in_RSI;
  long in_RDI;
  Value decoded;
  Value *in_stack_000000f8;
  Token *in_stack_00000100;
  Reader *in_stack_00000108;
  Value *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb4;
  
  Value::Value(in_stack_ffffffffffffff90,(ValueType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  bVar1 = decodeDouble(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  if (bVar1) {
    pVVar2 = currentValue((Reader *)0x1712ec);
    Value::swapPayload(pVVar2,in_stack_ffffffffffffff88);
    pVVar2 = currentValue((Reader *)0x17130e);
    Value::setOffsetStart(pVVar2,*(long *)(in_RSI + 8) - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((Reader *)0x171343);
    Value::setOffsetLimit(pVVar2,*(long *)(in_RSI + 0x10) - *(long *)(in_RDI + 0xc0));
  }
  Value::~Value((Value *)CONCAT44(in_stack_ffffffffffffffb4,1));
  return bVar1;
}

Assistant:

bool Reader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}